

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::io::(anonymous_namespace)::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test>
             *this)

{
  BlockSizes *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (BlockSizes *)operator_new(0x18);
  google::protobuf::io::anon_unknown_0::BlockSizes::BlockSizes(this_00);
  (this_00->super_CodedStreamTest).super_Test._vptr_Test = (_func_int **)&PTR__BlockSizes_01661f88;
  (this_00->super_WithParamInterface<int>)._vptr_WithParamInterface = (_func_int **)&DAT_01661fc8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }